

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

optional<tinyusdz::Property> * __thiscall
tinyusdz::tydra::(anonymous_namespace)::TypedTerminalAttributeToProperty<std::array<float,2ul>>
          (optional<tinyusdz::Property> *__return_storage_ptr__,_anonymous_namespace_ *this,
          TypedTerminalAttribute<std::array<float,_2UL>_> *input)

{
  bool bVar1;
  string *type_name;
  string local_11e0;
  Property local_11c0;
  Property local_be0;
  undefined1 local_600 [8];
  Property output;
  TypedTerminalAttribute<std::array<float,_2UL>_> *input_local;
  
  bVar1 = TypedTerminalAttribute<std::array<float,_2UL>_>::authored
                    ((TypedTerminalAttribute<std::array<float,_2UL>_> *)this);
  if (bVar1) {
    Property::Property((Property *)local_600);
    bVar1 = TypedTerminalAttribute<std::array<float,_2UL>_>::has_actual_type
                      ((TypedTerminalAttribute<std::array<float,_2UL>_> *)this);
    if (bVar1) {
      type_name = TypedTerminalAttribute<std::array<float,2ul>>::get_actual_type_name_abi_cxx11_
                            ((TypedTerminalAttribute<std::array<float,2ul>> *)this);
      Property::MakeEmptyAttrib(&local_be0,type_name,false);
      Property::operator=((Property *)local_600,&local_be0);
      Property::~Property(&local_be0);
    }
    else {
      TypedTerminalAttribute<std::array<float,2ul>>::type_name_abi_cxx11_();
      Property::MakeEmptyAttrib(&local_11c0,&local_11e0,false);
      Property::operator=((Property *)local_600,&local_11c0);
      Property::~Property(&local_11c0);
      ::std::__cxx11::string::~string((string *)&local_11e0);
    }
    nonstd::optional_lite::optional<tinyusdz::Property>::optional<tinyusdz::Property,_0>
              (__return_storage_ptr__,(Property *)local_600);
    Property::~Property((Property *)local_600);
  }
  else {
    nonstd::optional_lite::optional<tinyusdz::Property>::optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<Property> TypedTerminalAttributeToProperty(
    const TypedTerminalAttribute<T> &input) {
  if (!input.authored()) {
    // nothing to do
    return nonstd::nullopt;
  }

  Property output;

  // type info only
  if (input.has_actual_type()) {
    // type info only
    output = Property::MakeEmptyAttrib(input.get_actual_type_name(),
                                       /* custom */ false);
  } else {
    output = Property::MakeEmptyAttrib(input.type_name(), /* custom */ false);
  }

  return output;
}